

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

bool __thiscall
DependencyScan::RecomputeNodeDirty
          (DependencyScan *this,Node *node,vector<Node_*,_std::allocator<Node_*>_> *stack,
          vector<Node_*,_std::allocator<Node_*>_> *validation_nodes,string *err)

{
  pointer *pppNVar1;
  Edge *edge;
  iterator __position;
  Node *pNVar2;
  Edge *pEVar3;
  pointer ppNVar4;
  vector<Node*,std::allocator<Node*>> *validation_nodes_00;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  pointer ppNVar8;
  string *err_00;
  pointer ppNVar9;
  bool dirty;
  bool local_52;
  byte local_51;
  Node *local_50;
  Node *local_48;
  vector<Node_*,_std::allocator<Node_*>_> *local_40;
  vector<Node*,std::allocator<Node*>> *local_38;
  
  edge = node->in_edge_;
  local_50 = node;
  if (edge == (Edge *)0x0) {
    if (node->exists_ != ExistenceStatusUnknown) {
      return true;
    }
    bVar5 = Node::Stat(node,this->disk_interface_,err);
    if (bVar5) {
      if ((local_50->exists_ != ExistenceStatusExists) && (g_explaining == true)) {
        RecomputeNodeDirty((DependencyScan *)local_50);
      }
      local_50->dirty_ = local_50->exists_ != ExistenceStatusExists;
      return true;
    }
  }
  else {
    if (edge->mark_ == VisitDone) {
      return true;
    }
    err_00 = err;
    bVar5 = VerifyDAG(this,node,stack,err);
    if (bVar5) {
      edge->mark_ = VisitInStack;
      __position._M_current =
           (stack->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (stack->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)stack,__position,&local_50);
      }
      else {
        *__position._M_current = local_50;
        pppNVar1 = &(stack->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
      local_52 = false;
      edge->outputs_ready_ = true;
      edge->deps_missing_ = false;
      if (((edge->deps_loaded_ == false) && (pNVar2 = edge->dyndep_, pNVar2 != (Node *)0x0)) &&
         (pNVar2->dyndep_pending_ == true)) {
        err_00 = err;
        bVar5 = RecomputeNodeDirty(this,pNVar2,stack,validation_nodes,err);
        if (!bVar5) {
          return false;
        }
        pEVar3 = edge->dyndep_->in_edge_;
        if (((pEVar3 == (Edge *)0x0) || (pEVar3->outputs_ready_ == true)) &&
           (bVar5 = DyndepLoader::LoadDyndeps(&this->dyndep_loader_,edge->dyndep_,err), !bVar5)) {
          return false;
        }
      }
      local_38 = (vector<Node*,std::allocator<Node*>> *)validation_nodes;
      for (ppNVar8 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start; validation_nodes_00 = local_38,
          ppNVar8 !=
          (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppNVar8 = ppNVar8 + 1) {
        if (((*ppNVar8)->exists_ == ExistenceStatusUnknown) &&
           (bVar5 = Node::Stat(*ppNVar8,this->disk_interface_,err), !bVar5)) {
          return false;
        }
      }
      if (edge->deps_loaded_ == false) {
        edge->deps_loaded_ = true;
        bVar5 = ImplicitDepLoader::LoadDeps(&this->dep_loader_,edge,err);
        if (!bVar5) {
          if (err->_M_string_length != 0) {
            return false;
          }
          edge->deps_missing_ = true;
          local_52 = true;
        }
      }
      std::vector<Node*,std::allocator<Node*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>>
                (validation_nodes_00,*(undefined8 *)(validation_nodes_00 + 8),
                 (edge->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (edge->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      ppNVar8 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar5 = ppNVar8 ==
              (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
      if (bVar5) {
        local_48 = (Node *)0x0;
        bVar7 = local_52;
      }
      else {
        local_51 = local_52;
        err_00 = err;
        bVar6 = RecomputeNodeDirty(this,*ppNVar8,stack,
                                   (vector<Node_*,_std::allocator<Node_*>_> *)validation_nodes_00,
                                   err);
        if (!bVar6) {
          return bVar5;
        }
        local_48 = (Node *)0x0;
        ppNVar4 = ppNVar8;
        local_40 = stack;
        while( true ) {
          ppNVar9 = ppNVar4 + 1;
          pNVar2 = *ppNVar4;
          if ((pNVar2->in_edge_ != (Edge *)0x0) && (pNVar2->in_edge_->outputs_ready_ == false)) {
            edge->outputs_ready_ = false;
          }
          ppNVar4 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)ppNVar8 - (long)ppNVar4 >> 3) <
              (ulong)(((long)(edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar4 >> 3) -
                     (long)edge->order_only_deps_)) {
            if (pNVar2->dirty_ == true) {
              local_51 = 1;
              if (g_explaining == true) {
                RecomputeNodeDirty((DependencyScan *)pNVar2);
              }
            }
            else if ((local_48 == (Node *)0x0) || (local_48->mtime_ < pNVar2->mtime_)) {
              local_48 = pNVar2;
            }
          }
          bVar5 = ppNVar9 ==
                  (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
          stack = local_40;
          bVar7 = local_51;
          if (bVar5) break;
          err_00 = err;
          bVar6 = RecomputeNodeDirty(this,*ppNVar9,local_40,
                                     (vector<Node_*,_std::allocator<Node_*>_> *)local_38,err);
          ppNVar8 = ppNVar8 + 1;
          ppNVar4 = ppNVar9;
          if (!bVar6) {
            return bVar5;
          }
        }
      }
      local_52 = (bool)bVar7;
      if ((bVar7 & 1) == 0) {
        RecomputeOutputsDirty(this,edge,local_48,&local_52,err_00);
      }
      ppNVar4 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppNVar8 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppNVar8 != ppNVar4; ppNVar8 = ppNVar8 + 1) {
        if (local_52 != false) {
          (*ppNVar8)->dirty_ = true;
        }
      }
      if ((local_52 != false) &&
         ((edge->rule_ != &State::kPhonyRule ||
          ((edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish)))) {
        edge->outputs_ready_ = false;
      }
      edge->mark_ = VisitDone;
      ppNVar8 = (stack->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppNVar8[-1] != local_50) {
        __assert_fail("stack->back() == node",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph.cc"
                      ,0xdc,
                      "bool DependencyScan::RecomputeNodeDirty(Node *, std::vector<Node *> *, std::vector<Node *> *, string *)"
                     );
      }
      (stack->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish = ppNVar8 + -1;
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool DependencyScan::RecomputeNodeDirty(Node* node, std::vector<Node*>* stack,
                                        std::vector<Node*>* validation_nodes,
                                        string* err) {
  Edge* edge = node->in_edge();
  if (!edge) {
    // If we already visited this leaf node then we are done.
    if (node->status_known())
      return true;
    // This node has no in-edge; it is dirty if it is missing.
    if (!node->StatIfNecessary(disk_interface_, err))
      return false;
    if (!node->exists())
      EXPLAIN("%s has no in-edge and is missing", node->path().c_str());
    node->set_dirty(!node->exists());
    return true;
  }

  // If we already finished this edge then we are done.
  if (edge->mark_ == Edge::VisitDone)
    return true;

  // If we encountered this edge earlier in the call stack we have a cycle.
  if (!VerifyDAG(node, stack, err))
    return false;

  // Mark the edge temporarily while in the call stack.
  edge->mark_ = Edge::VisitInStack;
  stack->push_back(node);

  bool dirty = false;
  edge->outputs_ready_ = true;
  edge->deps_missing_ = false;

  if (!edge->deps_loaded_) {
    // This is our first encounter with this edge.
    // If there is a pending dyndep file, visit it now:
    // * If the dyndep file is ready then load it now to get any
    //   additional inputs and outputs for this and other edges.
    //   Once the dyndep file is loaded it will no longer be pending
    //   if any other edges encounter it, but they will already have
    //   been updated.
    // * If the dyndep file is not ready then since is known to be an
    //   input to this edge, the edge will not be considered ready below.
    //   Later during the build the dyndep file will become ready and be
    //   loaded to update this edge before it can possibly be scheduled.
    if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
      if (!RecomputeNodeDirty(edge->dyndep_, stack, validation_nodes, err))
        return false;

      if (!edge->dyndep_->in_edge() ||
          edge->dyndep_->in_edge()->outputs_ready()) {
        // The dyndep file is ready, so load it now.
        if (!LoadDyndeps(edge->dyndep_, err))
          return false;
      }
    }
  }

  // Load output mtimes so we can compare them to the most recent input below.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!(*o)->StatIfNecessary(disk_interface_, err))
      return false;
  }

  if (!edge->deps_loaded_) {
    // This is our first encounter with this edge.  Load discovered deps.
    edge->deps_loaded_ = true;
    if (!dep_loader_.LoadDeps(edge, err)) {
      if (!err->empty())
        return false;
      // Failed to load dependency info: rebuild to regenerate it.
      // LoadDeps() did EXPLAIN() already, no need to do it here.
      dirty = edge->deps_missing_ = true;
    }
  }

  // Store any validation nodes from the edge for adding to the initial
  // nodes.  Don't recurse into them, that would trigger the dependency
  // cycle detector if the validation node depends on this node.
  // RecomputeDirty will add the validation nodes to the initial nodes
  // and recurse into them.
  validation_nodes->insert(validation_nodes->end(),
      edge->validations_.begin(), edge->validations_.end());

  // Visit all inputs; we're dirty if any of the inputs are dirty.
  Node* most_recent_input = NULL;
  for (vector<Node*>::iterator i = edge->inputs_.begin();
       i != edge->inputs_.end(); ++i) {
    // Visit this input.
    if (!RecomputeNodeDirty(*i, stack, validation_nodes, err))
      return false;

    // If an input is not ready, neither are our outputs.
    if (Edge* in_edge = (*i)->in_edge()) {
      if (!in_edge->outputs_ready_)
        edge->outputs_ready_ = false;
    }

    if (!edge->is_order_only(i - edge->inputs_.begin())) {
      // If a regular input is dirty (or missing), we're dirty.
      // Otherwise consider mtime.
      if ((*i)->dirty()) {
        EXPLAIN("%s is dirty", (*i)->path().c_str());
        dirty = true;
      } else {
        if (!most_recent_input || (*i)->mtime() > most_recent_input->mtime()) {
          most_recent_input = *i;
        }
      }
    }
  }

  // We may also be dirty due to output state: missing outputs, out of
  // date outputs, etc.  Visit all outputs and determine whether they're dirty.
  if (!dirty)
    if (!RecomputeOutputsDirty(edge, most_recent_input, &dirty, err))
      return false;

  // Finally, visit each output and update their dirty state if necessary.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (dirty)
      (*o)->MarkDirty();
  }

  // If an edge is dirty, its outputs are normally not ready.  (It's
  // possible to be clean but still not be ready in the presence of
  // order-only inputs.)
  // But phony edges with no inputs have nothing to do, so are always
  // ready.
  if (dirty && !(edge->is_phony() && edge->inputs_.empty()))
    edge->outputs_ready_ = false;

  // Mark the edge as finished during this walk now that it will no longer
  // be in the call stack.
  edge->mark_ = Edge::VisitDone;
  assert(stack->back() == node);
  stack->pop_back();

  return true;
}